

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,char *fileName,int numThreads,bool reconstructChunkOffsetTable)

{
  byte autoAddType;
  byte in_CL;
  int in_EDX;
  ContextInitializer *in_RSI;
  ContextInitializer *in_RDI;
  MultiPartInputFile *unaff_retaddr;
  undefined1 in_stack_ffffffffffffff5f;
  ContextInitializer local_90;
  ContextInitializer *filename;
  
  autoAddType = in_CL & 1;
  filename = in_RDI;
  memset(&local_90,0,0x78);
  ContextInitializer::ContextInitializer(&local_90);
  ContextInitializer::silentHeaderParse(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::strictHeaderValidation(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::disableChunkReconstruction(in_RDI,(bool)in_stack_ffffffffffffff5f);
  MultiPartInputFile(unaff_retaddr,(char *)filename,in_RSI,in_EDX,(bool)autoAddType);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile (
    const char fileName[], int numThreads, bool reconstructChunkOffsetTable)
    : MultiPartInputFile (
        fileName,
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .disableChunkReconstruction(!reconstructChunkOffsetTable),
        numThreads)
{
}